

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void encode_restoration_mode(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  aom_write_bit_buffer *in_RSI;
  AV1_COMMON *in_RDI;
  int s;
  RestorationInfo *rsi_1;
  int sb_size;
  RestorationInfo *rsi;
  int p;
  int chroma_none;
  int all_none;
  int num_planes;
  int local_4c;
  int local_20;
  
  if ((in_RDI->seq_params->enable_restoration != '\0') &&
     (((in_RDI->features).allow_intrabc & 1U) == 0)) {
    iVar3 = av1_num_planes(in_RDI);
    bVar1 = true;
    bVar2 = true;
    for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
      if (in_RDI->rst_info[local_20].frame_restoration_type != RESTORE_NONE) {
        bVar1 = false;
        bVar2 = (bool)(local_20 == 0 & bVar2);
      }
      switch(in_RDI->rst_info[local_20].frame_restoration_type) {
      case RESTORE_NONE:
        aom_wb_write_bit(in_RSI,0);
        aom_wb_write_bit(in_RSI,0);
        break;
      case RESTORE_WIENER:
        aom_wb_write_bit(in_RSI,1);
        aom_wb_write_bit(in_RSI,0);
        break;
      case RESTORE_SGRPROJ:
        aom_wb_write_bit(in_RSI,1);
        aom_wb_write_bit(in_RSI,1);
        break;
      case RESTORE_SWITCHABLE:
        aom_wb_write_bit(in_RSI,0);
        aom_wb_write_bit(in_RSI,1);
      }
    }
    if (!bVar1) {
      iVar4 = 0x40;
      if (in_RDI->seq_params->sb_size == BLOCK_128X128) {
        iVar4 = 0x80;
      }
      if (iVar4 == 0x40) {
        aom_wb_write_bit(in_RSI,(uint)(0x40 < in_RDI->rst_info[0].restoration_unit_size));
      }
      if (0x40 < in_RDI->rst_info[0].restoration_unit_size) {
        aom_wb_write_bit(in_RSI,(uint)(0x80 < in_RDI->rst_info[0].restoration_unit_size));
      }
    }
    if (1 < iVar3) {
      if (in_RDI->seq_params->subsampling_x < in_RDI->seq_params->subsampling_y) {
        local_4c = in_RDI->seq_params->subsampling_x;
      }
      else {
        local_4c = in_RDI->seq_params->subsampling_y;
      }
      if ((local_4c != 0) && (!bVar2)) {
        aom_wb_write_bit(in_RSI,(uint)(in_RDI->rst_info[1].restoration_unit_size !=
                                      in_RDI->rst_info[0].restoration_unit_size));
      }
    }
  }
  return;
}

Assistant:

static inline void encode_restoration_mode(AV1_COMMON *cm,
                                           struct aom_write_bit_buffer *wb) {
  assert(!cm->features.all_lossless);
  if (!cm->seq_params->enable_restoration) return;
  if (cm->features.allow_intrabc) return;
  const int num_planes = av1_num_planes(cm);
  int all_none = 1, chroma_none = 1;
  for (int p = 0; p < num_planes; ++p) {
    RestorationInfo *rsi = &cm->rst_info[p];
    if (rsi->frame_restoration_type != RESTORE_NONE) {
      all_none = 0;
      chroma_none &= p == 0;
    }
    switch (rsi->frame_restoration_type) {
      case RESTORE_NONE:
        aom_wb_write_bit(wb, 0);
        aom_wb_write_bit(wb, 0);
        break;
      case RESTORE_WIENER:
        aom_wb_write_bit(wb, 1);
        aom_wb_write_bit(wb, 0);
        break;
      case RESTORE_SGRPROJ:
        aom_wb_write_bit(wb, 1);
        aom_wb_write_bit(wb, 1);
        break;
      case RESTORE_SWITCHABLE:
        aom_wb_write_bit(wb, 0);
        aom_wb_write_bit(wb, 1);
        break;
      default: assert(0);
    }
  }
  if (!all_none) {
    assert(cm->seq_params->sb_size == BLOCK_64X64 ||
           cm->seq_params->sb_size == BLOCK_128X128);
    const int sb_size = cm->seq_params->sb_size == BLOCK_128X128 ? 128 : 64;

    RestorationInfo *rsi = &cm->rst_info[0];

    assert(rsi->restoration_unit_size >= sb_size);
    assert(RESTORATION_UNITSIZE_MAX == 256);

    if (sb_size == 64) {
      aom_wb_write_bit(wb, rsi->restoration_unit_size > 64);
    }
    if (rsi->restoration_unit_size > 64) {
      aom_wb_write_bit(wb, rsi->restoration_unit_size > 128);
    }
  }

  if (num_planes > 1) {
    int s =
        AOMMIN(cm->seq_params->subsampling_x, cm->seq_params->subsampling_y);
    if (s && !chroma_none) {
      aom_wb_write_bit(wb, cm->rst_info[1].restoration_unit_size !=
                               cm->rst_info[0].restoration_unit_size);
      assert(cm->rst_info[1].restoration_unit_size ==
                 cm->rst_info[0].restoration_unit_size ||
             cm->rst_info[1].restoration_unit_size ==
                 (cm->rst_info[0].restoration_unit_size >> s));
      assert(cm->rst_info[2].restoration_unit_size ==
             cm->rst_info[1].restoration_unit_size);
    } else if (!s) {
      assert(cm->rst_info[1].restoration_unit_size ==
             cm->rst_info[0].restoration_unit_size);
      assert(cm->rst_info[2].restoration_unit_size ==
             cm->rst_info[1].restoration_unit_size);
    }
  }
}